

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_serialize_map_element
          (t_ocaml_generator *this,ostream *out,t_map *tmap,string *kiter,string *viter)

{
  t_type *ptVar1;
  allocator local_229;
  string local_228;
  string local_208;
  undefined1 local_1e8 [8];
  t_field vfield;
  string local_130;
  string local_100;
  undefined1 local_e0 [8];
  t_field kfield;
  string *viter_local;
  string *kiter_local;
  t_map *tmap_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  kfield._168_8_ = viter;
  ptVar1 = t_map::get_key_type(tmap);
  std::__cxx11::string::string((string *)&local_100,(string *)kiter);
  t_field::t_field((t_field *)local_e0,ptVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&vfield.field_0xaf);
  generate_serialize_field(this,out,(t_field *)local_e0,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&vfield.field_0xaf);
  ptVar1 = t_map::get_val_type(tmap);
  std::__cxx11::string::string((string *)&local_208,(string *)viter);
  t_field::t_field((t_field *)local_1e8,ptVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"",&local_229);
  generate_serialize_field(this,out,(t_field *)local_1e8,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  t_field::~t_field((t_field *)local_1e8);
  t_field::~t_field((t_field *)local_e0);
  return;
}

Assistant:

void t_ocaml_generator::generate_serialize_map_element(ostream& out,
                                                       t_map* tmap,
                                                       string kiter,
                                                       string viter) {
  t_field kfield(tmap->get_key_type(), kiter);
  generate_serialize_field(out, &kfield);

  t_field vfield(tmap->get_val_type(), viter);
  generate_serialize_field(out, &vfield);
}